

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormalsUtil.h
# Opt level: O1

void MapFormalsWithoutRest<ByteCodeGenerator::EmitOneFunction(ParseNodeFnc*)::__2>
               (ParseNodeFnc *pnodeFunc,anon_class_16_2_85211fcd fn)

{
  RegSlot rhsLocation;
  Symbol *sym;
  ParseNodeVar *pPVar1;
  ParseNode *this;
  
  for (this = pnodeFunc->pnodeParams; this != (ParseNode *)0x0;
      this = ParseNode::GetFormalNext(this)) {
    pPVar1 = ParseNode::AsParseNodeVar(this);
    rhsLocation = pPVar1->sym->location;
    pPVar1 = ParseNode::AsParseNodeVar(this);
    sym = pPVar1->sym;
    pPVar1 = ParseNode::AsParseNodeVar(this);
    ByteCodeGenerator::EmitPropStore
              (fn.this,rhsLocation,sym,pPVar1->pid,*fn.funcInfo,false,false,false,false);
  }
  return;
}

Assistant:

void MapFormalsWithoutRest(ParseNodeFnc *pnodeFunc, Fn fn)
{
    return MapFormalsImpl<Fn, false>(pnodeFunc, fn);
}